

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

char * mbedtls_ssl_get_version(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->conf->transport == '\x01') {
    if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) {
      ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_3ceb67;
    }
    else {
      ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_3ceb7e;
    }
  }
  else if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) {
    ssl_local = (mbedtls_ssl_context *)0x3b2db6;
  }
  else if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_3) {
    ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_3ceba0;
  }
  else {
    ssl_local = (mbedtls_ssl_context *)0x39919d;
  }
  return (char *)ssl_local;
}

Assistant:

const char *mbedtls_ssl_get_version(const mbedtls_ssl_context *ssl)
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        switch (ssl->tls_version) {
            case MBEDTLS_SSL_VERSION_TLS1_2:
                return "DTLSv1.2";
            default:
                return "unknown (DTLS)";
        }
    }
#endif

    switch (ssl->tls_version) {
        case MBEDTLS_SSL_VERSION_TLS1_2:
            return "TLSv1.2";
        case MBEDTLS_SSL_VERSION_TLS1_3:
            return "TLSv1.3";
        default:
            return "unknown";
    }
}